

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O2

void __thiscall QHybrid::ComputeQ(QHybrid *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long *plVar3;
  int iVar4;
  uint lastJAI;
  long lVar5;
  PlanningUnitMADPDiscrete *this_00;
  JointBeliefInterface *pJVar6;
  ulong uVar7;
  E *this_01;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong local_48;
  BeliefIteratorGeneric it;
  undefined1 auVar12 [16];
  undefined1 extraout_var [56];
  
  lVar5 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
  lVar5 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar5) + 0x60))
                    (&(this->super_QFunctionJAOHInterface).field_0x0 + lVar5);
  if (lVar5 == 0) {
    this_01 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_01,"QHybrid::ComputeQ - GetPU() returns 0; no PlanningUnit available!");
  }
  else {
    lVar5 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
    this_00 = (PlanningUnitMADPDiscrete *)
              (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar5) + 0x60
                          ))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar5);
    pJVar6 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD(this_00);
    lVar5 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
    lVar5 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar5) + 0x60))
                      (&(this->super_QFunctionJAOHInterface).field_0x0 + lVar5);
    if (*(size_t *)(lVar5 + 0x18) != this->_m_horizonLastTimeSteps) {
      lastJAI = 0;
      while( true ) {
        uVar8 = (ulong)lastJAI;
        lVar5 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
        lVar5 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar5) +
                            0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar5);
        uVar7 = (**(code **)(**(long **)(lVar5 + 0x30) + 0x68))();
        if (uVar7 <= uVar8) break;
        (**(code **)(*(long *)(&pJVar6->field_0x0 + *(long *)((long)*pJVar6 + -0xb8)) + 0x98))
                  (&it,&pJVar6->field_0x0 + *(long *)((long)*pJVar6 + -0xb8));
        local_48 = 0;
        do {
          lVar5 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
          lVar5 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar5) +
                              0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar5);
          iVar4 = (*(it._m_it)->_vptr_BeliefIteratorInterface[3])();
          uVar9 = (**(code **)(**(long **)(lVar5 + 0x330) + 0xc0))
                            (*(long **)(lVar5 + 0x330),iVar4,uVar8);
          uVar7 = uVar9;
          (*(it._m_it)->_vptr_BeliefIteratorInterface[2])();
          iVar4 = (*(it._m_it)->_vptr_BeliefIteratorInterface[4])();
          auVar11._8_8_ = 0;
          auVar11._0_8_ = local_48;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = uVar7;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar9;
          auVar1 = vfmadd231sd_fma(auVar11,auVar14,auVar1);
          local_48 = auVar1._0_8_;
        } while ((char)iVar4 != '\0');
        dVar10 = ComputeRecursively(this,1,0,lastJAI);
        lVar5 = *(long *)((long)this->super_QFunctionJAOHInterface + -0x88);
        lVar5 = (**(code **)(*(long *)(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar5) +
                            0x60))(&(this->super_QFunctionJAOHInterface).field_0x0 + lVar5);
        plVar3 = *(long **)(lVar5 + 0x330);
        auVar13._0_8_ =
             (**(code **)(*(long *)((long)plVar3 + *(long *)(*plVar3 + -0xb0)) + 0x70))
                       ((long)plVar3 + *(long *)(*plVar3 + -0xb0));
        auVar13._8_56_ = extraout_var;
        auVar12 = auVar13._0_16_;
        it._vptr_BeliefIteratorGeneric = (_func_int **)&PTR__BeliefIteratorGeneric_005d3870;
        if (it._m_it != (BeliefIteratorInterface *)0x0) {
          (*(it._m_it)->_vptr_BeliefIteratorInterface[1])();
          auVar12._8_8_ = 0;
          auVar12._0_8_ = auVar13._0_8_;
        }
        auVar15._8_8_ = 0;
        auVar15._0_8_ = dVar10;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_48;
        auVar1 = vfmadd213sd_fma(auVar15,auVar12,auVar2);
        (this->_m_QValuesFirstTimeSteps).super_matrix_t.data_.data_[uVar8] = auVar1._0_8_;
        lastJAI = lastJAI + 1;
      }
      if (pJVar6 != (JointBeliefInterface *)0x0) {
        (**(code **)((long)*pJVar6 + 8))(pJVar6);
      }
      return;
    }
    this_01 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_01,"QHybrid::ComputeQ - last_t is true, not possible");
  }
  __cxa_throw(this_01,&E::typeinfo,E::~E);
}

Assistant:

void QHybrid::ComputeQ()
{
    if(GetPU() == 0)
        throw E("QHybrid::ComputeQ - GetPU() returns 0; no PlanningUnit available!");

    size_t time_step = 0;
    JointBeliefInterface* b0p = GetPU()->GetNewJointBeliefFromISD(); 
    JointBeliefInterface& b0 =  *b0p;
    
    bool last_t = false;
    if( (time_step) == (GetPU()->GetHorizon() -
                        _m_horizonLastTimeSteps))
        last_t = true;

    if(last_t)
        throw E("QHybrid::ComputeQ - last_t is true, not possible");


    size_t empty_jaohI = 0;
    for(Index newJAI=0; newJAI < GetPU()->GetNrJointActions(); newJAI++)
    {
        double Q=0.0;
        if(last_t)
        {
            if(_m_QlastTimeSteps)
                Q = _m_QlastTimeSteps->GetQ(b0,
                                            Globals::INITIAL_JAOHI,
                                            newJAI);
            else
            {
                BeliefIteratorGeneric it=b0.GetIterator();
                do
                {
                    double r_s_ja = GetPU()->GetReward(it.GetStateIndex(), newJAI);
                    double prob_s = it.GetProbability();
                    Q += r_s_ja * prob_s;
                } while(it.Next());
                
            }
        }
        else
        {
            //calculate R(joah',newJA) - expected immediate reward for time_step
            double exp_imm_R = 0.0;
            BeliefIteratorGeneric it=b0.GetIterator();
            do
            {
                double r_s_ja = GetPU()->GetReward(it.GetStateIndex(), newJAI);
                double prob_s = it.GetProbability();
                exp_imm_R += r_s_ja * prob_s;
            } while(it.Next());

            double exp_fut_R = ComputeRecursively( 1, Globals::INITIAL_JAOHI, newJAI);

            Q = exp_imm_R + GetPU()->GetDiscount() * exp_fut_R;
        }
        _m_QValuesFirstTimeSteps(empty_jaohI,newJAI)=Q;
    }//end for newJAI

    delete b0p;
    return;
}